

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void array_suite::fail_missing_end(void)

{
  bool value [4];
  value_type input [6];
  iarchive in;
  bool local_d4 [4];
  uchar local_d0 [40];
  iarchive local_a8;
  
  local_d0[4] = 0x80;
  local_d0[5] = 0x81;
  local_d0[0] = 0x92;
  local_d0[1] = '\x04';
  local_d0[2] = 0x80;
  local_d0[3] = 0x81;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[6]>(&local_a8,(uchar (*) [6])local_d0)
  ;
  local_d4[0] = false;
  local_d4[1] = false;
  local_d4[2] = false;
  local_d4[3] = false;
  trial::protocol::bintoken::iarchive::load_override<bool[4]>(&local_a8,&local_d4);
  boost::detail::throw_failed_impl
            ("in >> value","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x129,"void array_suite::fail_missing_end()");
  trial::protocol::bintoken::iarchive::~iarchive(&local_a8);
  return;
}

Assistant:

void fail_missing_end()
{
    const value_type input[] = { token::code::begin_array,
                                 0x04,
                                 0x80, 0x81, 0x80, 0x81 };
    format::iarchive in(input);
    bool value[4] = { false, false, false, false };
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(in >> value,
                                    format::error, "expected end array bracket");
}